

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void reg_reg12_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  ushort uVar2;
  m680x_reg mVar3;
  byte bVar4;
  long lVar5;
  m680x_insn mVar6;
  byte bVar7;
  
  uVar2 = *address;
  *address = uVar2 + 1;
  lVar5 = (ulong)uVar2 - (ulong)info->offset;
  if ((uint)lVar5 < info->size) {
    bVar4 = info->code[lVar5];
    mVar6 = M680X_INS_EXG;
    if (-1 < (char)bVar4) {
      mVar6 = M680X_INS_TFR;
    }
  }
  else {
    mVar6 = M680X_INS_TFR;
    bVar4 = 0;
  }
  info->insn = mVar6;
  mVar3 = reg_reg12_hdlr::g_tfr_exg12_reg0_ids[bVar4 >> 4 & 7];
  bVar1 = (info->m680x).op_count;
  bVar7 = bVar1 + 1;
  (info->m680x).op_count = bVar7;
  (info->m680x).operands[bVar1].type = M680X_OP_REGISTER;
  (info->m680x).operands[bVar1].field_1.reg = mVar3;
  (info->m680x).operands[bVar1].size = info->cpu->reg_byte_size[mVar3];
  mVar3 = reg_reg12_hdlr::g_tfr_exg12_reg1_ids[bVar4 & 7];
  (info->m680x).op_count = bVar1 + 2;
  (info->m680x).operands[bVar7].type = M680X_OP_REGISTER;
  (info->m680x).operands[bVar7].field_1.reg = mVar3;
  (info->m680x).operands[bVar7].size = info->cpu->reg_byte_size[mVar3];
  return;
}

Assistant:

static void reg_reg12_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg g_tfr_exg12_reg0_ids[] = {
		M680X_REG_A, M680X_REG_B,  M680X_REG_CC,  M680X_REG_TMP3,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y,  M680X_REG_S,
	};
	static const m680x_reg g_tfr_exg12_reg1_ids[] = {
		M680X_REG_A, M680X_REG_B,  M680X_REG_CC,  M680X_REG_TMP2,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y,  M680X_REG_S,
	};
	uint8_t regs = 0;

	read_byte(info, &regs, (*address)++);

	// The opcode of this instruction depends on
	// the msb of its post byte.
	if (regs & 0x80)
		info->insn = M680X_INS_EXG;
	else
		info->insn = M680X_INS_TFR;

	add_reg_operand(info, g_tfr_exg12_reg0_ids[(regs >> 4) & 0x07]);
	add_reg_operand(info, g_tfr_exg12_reg1_ids[regs & 0x07]);
}